

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O0

void Abc_ConvertAigToBdd_rec1(DdManager *dd,Hop_Obj_t *pObj)

{
  int iVar1;
  Hop_Obj_t *pHVar2;
  Hop_Obj_t *g;
  DdNode *pDVar3;
  Hop_Obj_t *pObj_local;
  DdManager *dd_local;
  
  iVar1 = Hop_IsComplement(pObj);
  if (iVar1 != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                  ,0x2d5,"void Abc_ConvertAigToBdd_rec1(DdManager *, Hop_Obj_t *)");
  }
  iVar1 = Hop_ObjIsNode(pObj);
  if ((iVar1 != 0) && (iVar1 = Hop_ObjIsMarkA(pObj), iVar1 == 0)) {
    pHVar2 = Hop_ObjFanin0(pObj);
    Abc_ConvertAigToBdd_rec1(dd,pHVar2);
    pHVar2 = Hop_ObjFanin1(pObj);
    Abc_ConvertAigToBdd_rec1(dd,pHVar2);
    pHVar2 = Hop_ObjChild0Copy(pObj);
    g = Hop_ObjChild1Copy(pObj);
    pDVar3 = Cudd_bddAnd(dd,(DdNode *)pHVar2,(DdNode *)g);
    (pObj->field_0).pData = pDVar3;
    Cudd_Ref((DdNode *)(pObj->field_0).pData);
    iVar1 = Hop_ObjIsMarkA(pObj);
    if (iVar1 != 0) {
      __assert_fail("!Hop_ObjIsMarkA(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                    ,0x2dc,"void Abc_ConvertAigToBdd_rec1(DdManager *, Hop_Obj_t *)");
    }
    Hop_ObjSetMarkA(pObj);
  }
  return;
}

Assistant:

void Abc_ConvertAigToBdd_rec1( DdManager * dd, Hop_Obj_t * pObj )
{
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || Hop_ObjIsMarkA(pObj) )
        return;
    Abc_ConvertAigToBdd_rec1( dd, Hop_ObjFanin0(pObj) ); 
    Abc_ConvertAigToBdd_rec1( dd, Hop_ObjFanin1(pObj) );
    pObj->pData = Cudd_bddAnd( dd, (DdNode *)Hop_ObjChild0Copy(pObj), (DdNode *)Hop_ObjChild1Copy(pObj) ); 
    Cudd_Ref( (DdNode *)pObj->pData );
    assert( !Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjSetMarkA( pObj );
}